

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlatm1.c
# Opt level: O3

int dlatm1_slu(int *mode,double *cond,int *irsign,int *idist,int *iseed,double *d,int *n,int *info)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int local_34;
  
  *info = 0;
  auVar4 = _DAT_00123640;
  auVar3 = _DAT_00123630;
  uVar1 = *n;
  uVar10 = (ulong)uVar1;
  if (uVar10 == 0) {
    return 0;
  }
  iVar6 = *mode;
  if (iVar6 - 7U < 0xfffffff3) {
    local_34 = 1;
    iVar6 = -1;
    goto LAB_0010b6ca;
  }
  if (iVar6 == -6) goto LAB_0010b56f;
  if (iVar6 == 0) goto LAB_0010b5d6;
  if (iVar6 == 6) goto LAB_0010b56f;
  if (1 < (uint)*irsign) {
    local_34 = 2;
    iVar6 = -2;
    goto LAB_0010b6ca;
  }
  if (iVar6 == -6) {
LAB_0010b56f:
    if (*idist - 4U < 0xfffffffd) {
      local_34 = 4;
      iVar6 = -4;
      goto LAB_0010b6ca;
    }
  }
  else if (iVar6 != 0) {
    if (iVar6 != 6) {
      if (*cond <= 1.0 && *cond != 1.0) {
        local_34 = 3;
        iVar6 = -3;
        goto LAB_0010b6ca;
      }
      if ((iVar6 != 6) && (iVar6 != -6)) goto LAB_0010b5d6;
    }
    goto LAB_0010b56f;
  }
LAB_0010b5d6:
  if (-1 < (int)uVar1) {
    if (iVar6 == 0) {
      return 0;
    }
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    switch(iVar5) {
    case 2:
      dlatm1_slu::i = uVar1 + 1;
      lVar9 = uVar10 - 1;
      auVar13._8_4_ = (int)lVar9;
      auVar13._0_8_ = lVar9;
      auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar7 = 0;
      auVar13 = auVar13 ^ _DAT_00123640;
      do {
        auVar15._8_4_ = (int)uVar7;
        auVar15._0_8_ = uVar7;
        auVar15._12_4_ = (int)(uVar7 >> 0x20);
        auVar14 = (auVar15 | auVar3) ^ auVar4;
        if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                    auVar13._4_4_ < auVar14._4_4_) & 1)) {
          d[uVar7] = 1.0;
        }
        if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
            auVar14._12_4_ <= auVar13._12_4_) {
          d[uVar7 + 1] = 1.0;
        }
        uVar7 = uVar7 + 2;
      } while ((dlatm1_slu::i & 0xfffffffe) != uVar7);
      d[uVar10 - 1] = 1.0 / *cond;
      break;
    case 3:
      *d = 1.0;
      if (uVar1 != 1) {
        dlatm1_slu::alpha = pow(*cond,-1.0 / (double)(int)(uVar1 - 1));
        iVar6 = *n;
        dlatm1_slu::i = 2;
        if (1 < iVar6) {
          lVar9 = 1;
          do {
            dVar12 = powi(dlatm1_slu::alpha,(int)lVar9);
            lVar9 = (long)dlatm1_slu::i;
            d[lVar9 + -1] = dVar12;
            iVar5 = dlatm1_slu::i + 1;
            bVar2 = dlatm1_slu::i < iVar6;
            dlatm1_slu::i = iVar5;
          } while (bVar2);
        }
      }
      break;
    case 4:
      *d = 1.0;
      auVar4 = _DAT_00123640;
      auVar3 = _DAT_00123630;
      if (uVar1 != 1) {
        dVar11 = 1.0 / *cond;
        dVar12 = (1.0 - dVar11) / (double)(int)(uVar1 - 1);
        lVar9 = uVar10 - 2;
        auVar14._8_4_ = (int)lVar9;
        auVar14._0_8_ = lVar9;
        auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar10 = 0;
        auVar14 = auVar14 ^ _DAT_00123640;
        dlatm1_slu::alpha = dVar12;
        do {
          iVar6 = (int)uVar10;
          auVar16._8_4_ = iVar6;
          auVar16._0_8_ = uVar10;
          auVar16._12_4_ = (int)(uVar10 >> 0x20);
          auVar16 = (auVar16 | auVar3) ^ auVar4;
          if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                      auVar14._4_4_ < auVar16._4_4_) & 1)) {
            d[uVar10 + 1] = (double)(int)((uVar1 - iVar6) + -2) * dVar12 + dVar11;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            d[uVar10 + 2] = (double)(int)((uVar1 - iVar6) + -3) * dVar12 + dVar11;
          }
          uVar10 = uVar10 + 2;
          dlatm1_slu::i = uVar1 + 1;
        } while ((uVar1 & 0x7ffffffe) != uVar10);
      }
      break;
    case 5:
      dlatm1_slu::alpha = log(1.0 / *cond);
      iVar6 = *n;
      dlatm1_slu::i = 1;
      if (0 < iVar6) {
        do {
          dVar12 = dlatm1_slu::alpha;
          dVar11 = dlaran_slu(iseed);
          dVar12 = exp(dVar11 * dVar12);
          d[(long)dlatm1_slu::i + -1] = dVar12;
          iVar5 = dlatm1_slu::i + 1;
          bVar2 = dlatm1_slu::i < iVar6;
          dlatm1_slu::i = iVar5;
        } while (bVar2);
      }
      break;
    case 6:
      dlarnv_slu(idist,iseed,n,d);
      break;
    default:
      dlatm1_slu::i = uVar1 + 1;
      uVar7 = 0;
      do {
        d[uVar7] = 1.0 / *cond;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
      *d = 1.0;
    }
    iVar6 = *mode;
    if (((0xc < iVar6 + 6U) || ((0x1041U >> (iVar6 + 6U & 0x1f) & 1) == 0)) && (*irsign == 1)) {
      iVar5 = *n;
      dlatm1_slu::i = 1;
      if (0 < iVar5) {
        do {
          dVar12 = dlaran_slu(iseed);
          if (0.5 < dVar12) {
            d[(long)dlatm1_slu::i + -1] = -d[(long)dlatm1_slu::i + -1];
          }
          iVar6 = dlatm1_slu::i + 1;
          bVar2 = dlatm1_slu::i < iVar5;
          dlatm1_slu::i = iVar6;
        } while (bVar2);
        iVar6 = *mode;
      }
    }
    if (-1 < iVar6) {
      return 0;
    }
    uVar1 = *n;
    if ((int)uVar1 < 2) {
      dlatm1_slu::i = 1;
      return 0;
    }
    pdVar8 = d + uVar1;
    uVar10 = 0;
    do {
      pdVar8 = pdVar8 + -1;
      dVar12 = d[uVar10];
      d[uVar10] = *pdVar8;
      *pdVar8 = dVar12;
      uVar10 = uVar10 + 1;
    } while (uVar1 >> 1 != uVar10);
    dlatm1_slu::i = (uVar1 >> 1) + 1;
    return 0;
  }
  local_34 = 7;
  iVar6 = -7;
LAB_0010b6ca:
  *info = iVar6;
  input_error("DLATM1",&local_34);
  return 0;
}

Assistant:

int dlatm1_slu(int *mode, double *cond, int *irsign,
	 int *idist, int *iseed, double *d, int *n, int *
	info)
{
    /* System generated locals */
    int i__1, i__2;
    double d__1;

    /* Local variables */
    static double temp;
    static int i;
    static double alpha;
    extern double dlaran_slu(int *);
    extern /* Subroutine */ int dlarnv_slu(int *, int *, int *, double *);
    extern int input_error(char *, int *);


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

       DLATM1 computes the entries of D(1..N) as specified by   
       MODE, COND and IRSIGN. IDIST and ISEED determine the generation   
       of random numbers. DLATM1 is called by SLATMR to generate   
       random test matrices for LAPACK programs.   

    Arguments   
    =========   

    MODE   - INTEGER   
             On entry describes how D is to be computed:   
             MODE = 0 means do not change D.   
             MODE = 1 sets D(1)=1 and D(2:N)=1.0/COND   
             MODE = 2 sets D(1:N-1)=1 and D(N)=1.0/COND   
             MODE = 3 sets D(I)=COND**(-(I-1)/(N-1))   
             MODE = 4 sets D(i)=1 - (i-1)/(N-1)*(1 - 1/COND)   
             MODE = 5 sets D to random numbers in the range   
                      ( 1/COND , 1 ) such that their logarithms   
                      are uniformly distributed.   
             MODE = 6 set D to random numbers from same distribution   
                      as the rest of the matrix.   
             MODE < 0 has the same meaning as ABS(MODE), except that   
                the order of the elements of D is reversed.   
             Thus if MODE is positive, D has entries ranging from   
                1 to 1/COND, if negative, from 1/COND to 1,   
             Not modified.   

    COND   - DOUBLE PRECISION   
             On entry, used as described under MODE above.   
             If used, it must be >= 1. Not modified.   

    IRSIGN - INTEGER   
             On entry, if MODE neither -6, 0 nor 6, determines sign of   
             entries of D   
             0 => leave entries of D unchanged   
             1 => multiply each entry of D by 1 or -1 with probability .5 
  

    IDIST  - CHARACTER*1   
             On entry, IDIST specifies the type of distribution to be   
             used to generate a random matrix .   
             1 => UNIFORM( 0, 1 )   
             2 => UNIFORM( -1, 1 )   
             3 => NORMAL( 0, 1 )   
             Not modified.   

    ISEED  - INTEGER array, dimension ( 4 )   
             On entry ISEED specifies the seed of the random number   
             generator. The random number generator uses a   
             linear congruential sequence limited to small   
             integers, and so should produce machine independent   
             random numbers. The values of ISEED are changed on   
             exit, and can be used in the next call to DLATM1   
             to continue the same random number sequence.   
             Changed on exit.   

    D      - DOUBLE PRECISION array, dimension ( MIN( M , N ) )   
             Array to be computed according to MODE, COND and IRSIGN.   
             May be changed on exit if MODE is nonzero.   

    N      - INTEGER   
             Number of entries of D. Not modified.   

    INFO   - INTEGER   
              0  => normal termination   
             -1  => if MODE not in range -6 to 6   
             -2  => if MODE neither -6, 0 nor 6, and   
                    IRSIGN neither 0 nor 1   
             -3  => if MODE neither -6, 0 nor 6 and COND less than 1   
             -4  => if MODE equals 6 or -6 and IDIST not in range 1 to 3 
  
             -7  => if N negative   

    ===================================================================== 
  


       Decode and Test the input parameters. Initialize flags & seed.   

       Parameter adjustments */
    --d;
    --iseed;

    /* Function Body */
    *info = 0;

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

/*     Set INFO if an error */

    if (*mode < -6 || *mode > 6) {
	*info = -1;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && (*irsign != 0 && *
	    irsign != 1)) {
	*info = -2;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && *cond < 1.) {
	*info = -3;
    } else if ((*mode == 6 || *mode == -6) && (*idist < 1 || *idist > 3)) {
	*info = -4;
    } else if (*n < 0) {
	*info = -7;
    }

    if (*info != 0) {
	i__1 = -(*info);
	input_error("DLATM1", &i__1);
	return 0;
    }

/*     Compute D according to COND and MODE */

    if (*mode != 0) {
	switch (abs(*mode)) {
	    case 1:  goto L10;
	    case 2:  goto L30;
	    case 3:  goto L50;
	    case 4:  goto L70;
	    case 5:  goto L90;
	    case 6:  goto L110;
	}

/*        One large D value: */

L10:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1. / *cond;
/* L20: */
	}
	d[1] = 1.;
	goto L120;

/*        One small D value: */

L30:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1.;
/* L40: */
	}
	d[*n] = 1. / *cond;
	goto L120;

/*        Exponentially distributed D values: */

L50:
	d[1] = 1.;
	if (*n > 1) {
	    d__1 = -1. / (double) (*n - 1);
            alpha = pow(*cond, d__1);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		i__2 = i - 1;
		d[i] = powi(alpha, i__2);
/* L60: */
	    }
	}
	goto L120;

/*        Arithmetically distributed D values: */

L70:
	d[1] = 1.;
	if (*n > 1) {
	    temp = 1. / *cond;
	    alpha = (1. - temp) / (double) (*n - 1);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		d[i] = (double) (*n - i) * alpha + temp;
/* L80: */
	    }
	}
	goto L120;

/*        Randomly distributed D values on ( 1/COND , 1): */

L90:
	alpha = log(1. / *cond);
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = exp(alpha * dlaran_slu(&iseed[1]));
/* L100: */
	}
	goto L120;

/*        Randomly distributed D values from IDIST */

L110:
	dlarnv_slu(idist, &iseed[1], n, &d[1]);

L120:

/*        If MODE neither -6 nor 0 nor 6, and IRSIGN = 1, assign   
          random signs to D */

	if (*mode != -6 && *mode != 0 && *mode != 6 && *irsign == 1) {
	    i__1 = *n;
	    for (i = 1; i <= i__1; ++i) {
		temp = dlaran_slu(&iseed[1]);
		if (temp > .5) {
		    d[i] = -d[i];
		}
/* L130: */
	    }
	}

/*        Reverse if MODE < 0 */

	if (*mode < 0) {
	    i__1 = *n / 2;
	    for (i = 1; i <= i__1; ++i) {
		temp = d[i];
		d[i] = d[*n + 1 - i];
		d[*n + 1 - i] = temp;
/* L140: */
	    }
	}

    }

    return 0;

/*     End of DLATM1 */

}